

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_base.hpp
# Opt level: O0

void boost::detail::function::functor_manager<boost::detail::forward>::manage
               (function_buffer *in_buffer,function_buffer *out_buffer,
               functor_manager_operation_type op)

{
  type_info_t *ptVar1;
  int in_EDX;
  undefined8 *in_RSI;
  undefined8 in_RDI;
  stl_type_index local_20 [2];
  undefined8 *local_10;
  
  if (in_EDX == 4) {
    local_10 = in_RSI;
    local_20[0].data_ = (type_info_t *)typeindex::type_id<boost::detail::forward>();
    ptVar1 = typeindex::stl_type_index::type_info(local_20);
    *local_10 = ptVar1;
    *(undefined1 *)(local_10 + 1) = 0;
    *(undefined1 *)((long)local_10 + 9) = 0;
  }
  else {
    manager(in_RDI,in_RSI,in_EDX);
  }
  return;
}

Assistant:

static inline void
        manage(const function_buffer& in_buffer, function_buffer& out_buffer,
               functor_manager_operation_type op)
        {
          typedef typename get_function_tag<functor_type>::type tag_type;
          switch (op) {
          case get_functor_type_tag:
            out_buffer.members.type.type = &boost::typeindex::type_id<functor_type>().type_info();
            out_buffer.members.type.const_qualified = false;
            out_buffer.members.type.volatile_qualified = false;
            return;

          default:
            manager(in_buffer, out_buffer, op, tag_type());
            return;
          }
        }